

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

void cancel_item(obj *obj)

{
  boolean bVar1;
  schar sVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  bool local_11a;
  bool local_119;
  char local_118 [8];
  char buf [256];
  boolean worn;
  boolean holy;
  boolean u_ring;
  obj *obj_local;
  
  bVar6 = obj == uleft;
  bVar7 = obj == uright;
  local_119 = bVar6 || bVar7;
  buf[0xff] = local_119;
  local_11a = false;
  if (obj->otyp == 0x14f) {
    local_11a = (*(uint *)&obj->field_0x4a >> 1 & 1) != 0;
  }
  buf[0xfe] = local_11a;
  switch(obj->otyp) {
  case 0x51:
    if (((obj->owornmask & 4U) != 0) && (obj == uarmh)) {
      u.abon.a[1] = u.abon.a[1] - obj->spe;
      u.abon.a[2] = u.abon.a[2] - obj->spe;
      iflags.botl = '\x01';
    }
    break;
  case 0x92:
    if (((obj->owornmask & 0x10U) != 0) && (obj == uarmg)) {
      u.abon.a[3] = u.abon.a[3] - obj->spe;
      iflags.botl = '\x01';
    }
    break;
  case 0x9d:
    if (((obj->owornmask & 0x60000U) != 0) && (bVar6 || bVar7)) {
      u.abon.a[5] = u.abon.a[5] - obj->spe;
      iflags.botl = '\x01';
    }
    break;
  case 0x9e:
    if (((obj->owornmask & 0x60000U) != 0) && (bVar6 || bVar7)) {
      u.abon.a[0] = u.abon.a[0] - obj->spe;
      iflags.botl = '\x01';
    }
    break;
  case 0x9f:
    if (((obj->owornmask & 0x60000U) != 0) && (bVar6 || bVar7)) {
      u.abon.a[4] = u.abon.a[4] - obj->spe;
      iflags.botl = '\x01';
    }
    break;
  case 0xa0:
    if (((obj->owornmask & 0x60000U) != 0) && (bVar6 || bVar7)) {
      u.abon.a[1] = u.abon.a[1] - obj->spe;
      iflags.botl = '\x01';
    }
    break;
  case 0xa1:
    if (((obj->owornmask & 0x60000U) != 0) && (bVar6 || bVar7)) {
      u.abon.a[2] = u.abon.a[2] - obj->spe;
      iflags.botl = '\x01';
    }
    break;
  case 0xa2:
    if (((obj->owornmask & 0x60000U) != 0) && (bVar6 || bVar7)) {
      u.abon.a[3] = u.abon.a[3] - obj->spe;
      iflags.botl = '\x01';
    }
    break;
  case 0xa3:
    if (((obj->owornmask & 0x60000U) != 0) && (bVar6 || bVar7)) {
      u.uhitinc = u.uhitinc - obj->spe;
    }
    break;
  case 0xa4:
    if (((obj->owornmask & 0x60000U) != 0) && (bVar6 || bVar7)) {
      u.udaminc = u.udaminc - obj->spe;
    }
  }
  bVar1 = equip_is_worn(obj);
  if ((bVar1 != '\0') && (obj->spe != '\0')) {
    if ((obj->oprops & 0x100U) != 0) {
      u.abon.a[3] = u.abon.a[3] - obj->spe;
      iflags.botl = '\x01';
    }
    if ((obj->oprops & 0x200U) != 0) {
      u.abon.a[1] = u.abon.a[1] - obj->spe;
      u.abon.a[2] = u.abon.a[2] - obj->spe;
      iflags.botl = '\x01';
    }
  }
  if ((0x53 < obj->otyp) && (obj->otyp < 0x5f)) {
    buf[0xfd] = obj == uarm;
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar3 = Shk_Your(local_118,obj);
      pcVar4 = xname(obj);
      pline("%s %s reverts to its natural form!",pcVar3,pcVar4);
    }
    else if ((bool)buf[0xfd]) {
      pline("Your armor feels looser.");
    }
    costly_cancel(obj);
    if (buf[0xfd] != '\0') {
      setworn((obj *)0x0,1);
    }
    obj->otyp = obj->otyp + 0xb;
    if (buf[0xfd] != '\0') {
      setworn(obj,1);
    }
  }
  if (((((byte)objects[obj->otyp].field_0x10 >> 4 & 1) != 0) ||
      ((obj->spe != '\0' &&
       (((obj->oclass == '\x03' || (obj->oclass == '\x02')) ||
        ((obj->oclass == '\x06' && (objects[obj->otyp].oc_subtyp != '\0')))))))) ||
     ((obj->otyp == 0x141 || (obj->otyp == 0x13f)))) {
    cVar5 = '\0';
    if (obj->oclass == '\v') {
      cVar5 = -1;
    }
    if ((((obj->spe != cVar5) && (obj->otyp != 0x1ca)) && (obj->otyp != 0xe9)) &&
       (obj->otyp != 0x10b)) {
      costly_cancel(obj);
      sVar2 = '\0';
      if (obj->oclass == '\v') {
        sVar2 = -1;
      }
      obj->spe = sVar2;
    }
    cVar5 = obj->oclass;
    if (cVar5 == '\b') {
      costly_cancel(obj);
      if ((obj->otyp == 0x13f) || (obj->otyp == 0x130)) {
        obj->otyp = 0x140;
      }
      else if (obj->otyp == 0x151) {
        obj->otyp = 0x150;
      }
      else {
        obj->otyp = 0x14f;
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffcff;
      }
    }
    else if (cVar5 == '\t') {
      costly_cancel(obj);
      obj->otyp = 0x17c;
      obj->spe = '\0';
    }
    else if (((cVar5 == '\n') && (obj->otyp != 0x1a1)) && (obj->otyp != 0x1bd)) {
      costly_cancel(obj);
      obj->otyp = 0x1bc;
    }
  }
  if (buf[0xfe] != '\0') {
    costly_cancel(obj);
  }
  unbless(obj);
  uncurse(obj);
  return;
}

Assistant:

void cancel_item(struct obj *obj)
{
	boolean	u_ring = (obj == uleft) || (obj == uright);
	boolean holy = (obj->otyp == POT_WATER && obj->blessed);

	switch(obj->otyp) {
		case RIN_GAIN_STRENGTH:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_STR) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_CONSTITUTION:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_CON) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_INTELLIGENCE:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_INT) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_WISDOM:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_WIS) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_DEXTERITY:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_DEX) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_ADORNMENT:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_CHA) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_INCREASE_ACCURACY:
			if ((obj->owornmask & W_RING) && u_ring)
				u.uhitinc -= obj->spe;
			break;
		case RIN_INCREASE_DAMAGE:
			if ((obj->owornmask & W_RING) && u_ring)
				u.udaminc -= obj->spe;
			break;
		case GAUNTLETS_OF_DEXTERITY:
			if ((obj->owornmask & W_ARMG) && (obj == uarmg)) {
				ABON(A_DEX) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case HELM_OF_BRILLIANCE:
			if ((obj->owornmask & W_ARMH) && (obj == uarmh)) {
				ABON(A_INT) -= obj->spe;
				ABON(A_WIS) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		/* case RIN_PROTECTION:  not needed */
	}

	if (equip_is_worn(obj) && obj->spe) {
	    if (obj->oprops & ITEM_DEXTERITY) {
		ABON(A_DEX) -= obj->spe;
		iflags.botl = 1;
	    }

	    if (obj->oprops & ITEM_BRILLIANCE) {
		ABON(A_INT) -= obj->spe;
		ABON(A_WIS) -= obj->spe;
		iflags.botl = 1;
	    }
	}

	/* MRKR: Cancelled *DSM reverts to scales.  */
	/*       Suggested by Daniel Morris in RGRN */

	if (obj->otyp >= GRAY_DRAGON_SCALE_MAIL &&
	    obj->otyp <= CHROMATIC_DRAGON_SCALE_MAIL) {
		/* dragon scale mail reverts to dragon scales */
		boolean worn = (obj == uarm);

		if (!Blind) {
			char buf[BUFSZ];
			pline("%s %s reverts to its natural form!",
			      Shk_Your(buf, obj), xname(obj));
		} else if (worn) {
			pline("Your armor feels looser.");
		}
		costly_cancel(obj);

		if (worn)
			setworn(NULL, W_ARM);

		/* assumes same order */
		obj->otyp = GRAY_DRAGON_SCALES +
			    obj->otyp - GRAY_DRAGON_SCALE_MAIL;

		if (worn)
			setworn(obj, W_ARM);
	}

	if (objects[obj->otyp].oc_magic
	    || (obj->spe && (obj->oclass == ARMOR_CLASS ||
			     obj->oclass == WEAPON_CLASS || is_weptool(obj)))
	    || obj->otyp == POT_ACID || obj->otyp == POT_SICKNESS) {
	    if (obj->spe != ((obj->oclass == WAND_CLASS) ? -1 : 0) &&
	       obj->otyp != WAN_CANCELLATION &&
		 /* can't cancel cancellation */
		 obj->otyp != MAGIC_LAMP &&
		 obj->otyp != CANDELABRUM_OF_INVOCATION) {
		costly_cancel(obj);
		obj->spe = (obj->oclass == WAND_CLASS) ? -1 : 0;
	    }
	    switch (obj->oclass) {
	      case SCROLL_CLASS:
		costly_cancel(obj);
		obj->otyp = SCR_BLANK_PAPER;
		obj->spe = 0;
		break;
	      case SPBOOK_CLASS:
		if (obj->otyp != SPE_CANCELLATION &&
			obj->otyp != SPE_BOOK_OF_THE_DEAD) {
		    costly_cancel(obj);
		    obj->otyp = SPE_BLANK_PAPER;
		}
		break;
	      case POTION_CLASS:
		costly_cancel(obj);
		if (obj->otyp == POT_SICKNESS ||
		    obj->otyp == POT_SEE_INVISIBLE) {
	    /* sickness is "biologically contaminated" fruit juice; cancel it
	     * and it just becomes fruit juice... whereas see invisible
	     * tastes like "enchanted" fruit juice, it similarly cancels.
	     */
		    obj->otyp = POT_FRUIT_JUICE;
		} else if (obj->otyp == POT_VAMPIRE_BLOOD) {
		    obj->otyp = POT_BLOOD;
		} else {
	            obj->otyp = POT_WATER;
		    obj->odiluted = 0; /* same as any other water */
		}
		break;
	    }
	}
	if (holy) costly_cancel(obj);
	unbless(obj);
	uncurse(obj);
#ifdef INVISIBLE_OBJECTS
	if (obj->oinvis) obj->oinvis = 0;
#endif
	return;
}